

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::EventsProcessorLeftMouseButtonUpEventTests::
EventsProcessorLeftMouseButtonUpEventTests(EventsProcessorLeftMouseButtonUpEventTests *this)

{
  StrictMock<solitaire::SolitaireMock> *__return_storage_ptr__;
  StrictMock<solitaire::ContextMock> *__return_storage_ptr___00;
  TypedExpectation<solitaire::interfaces::Solitaire_&()> *this_00;
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  *this_01;
  TypedExpectation<solitaire::geometry::Position_()> *this_02;
  ContextMock *this_03;
  SolitaireMock *this_04;
  ContextMock *this_05;
  undefined1 auStack_68 [32];
  ReturnAction<solitaire::geometry::Position> local_48;
  MockSpec<solitaire::interfaces::Solitaire_&()> local_38;
  
  this_03 = (ContextMock *)auStack_68;
  this_04 = (SolitaireMock *)auStack_68;
  this_05 = (ContextMock *)auStack_68;
  EventsProcessorTests::EventsProcessorTests(&this->super_EventsProcessorTests);
  (this->super_EventsProcessorTests).super_Test._vptr_Test =
       (_func_int **)&PTR__EventsProcessorLeftMouseButtonUpEventTests_002f44d0;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&this->cardsInHand,5,(allocator_type *)auStack_68);
  auStack_68[8] = '\x02';
  EventsProcessorTests::expectEvent(&this->super_EventsProcessorTests,(Event *)auStack_68);
  __return_storage_ptr___00 = &(this->super_EventsProcessorTests).contextMock;
  local_38.function_mocker_ =
       (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)
       ContextMock::gmock_getSolitaire
                 ((MockSpec<solitaire::interfaces::Solitaire_&()> *)__return_storage_ptr___00,
                  this_03);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<solitaire::interfaces::Solitaire_&()>::InternalExpectedAt
                      (&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x171,"contextMock","getSolitaire()");
  __return_storage_ptr__ = &(this->super_EventsProcessorTests).solitaireMock;
  local_48.value_.super___shared_ptr<solitaire::geometry::Position,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)__return_storage_ptr__;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)auStack_68,(ReturnRefAction *)&local_48
            );
  testing::internal::TypedExpectation<solitaire::interfaces::Solitaire_&()>::WillOnce
            (this_00,(Action<solitaire::interfaces::Solitaire_&()> *)auStack_68);
  std::_Function_base::~_Function_base((_Function_base *)auStack_68);
  local_38.function_mocker_ =
       (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)
       SolitaireMock::gmock_getCardsInHand
                 ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                   *)__return_storage_ptr__,this_04);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
            ::InternalExpectedAt
                      ((MockSpec<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                        *)&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x172,"solitaireMock","getCardsInHand()");
  local_48.value_.super___shared_ptr<solitaire::geometry::Position,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&this->cardsInHand;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
              *)auStack_68,(ReturnRefAction *)&local_48);
  testing::internal::
  TypedExpectation<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
  ::WillOnce(this_01,(Action<const_std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&()>
                      *)auStack_68);
  std::_Function_base::~_Function_base((_Function_base *)auStack_68);
  local_38.function_mocker_ =
       (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)
       ContextMock::gmock_getCardsInHandPosition
                 ((MockSpec<solitaire::geometry::Position_()> *)__return_storage_ptr___00,this_05);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<solitaire::geometry::Position_()>::InternalExpectedAt
                      ((MockSpec<solitaire::geometry::Position_()> *)&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x173,"contextMock","getCardsInHandPosition()");
  testing::internal::ReturnAction<solitaire::geometry::Position>::ReturnAction
            (&local_48,(Position)0x1a0000002e);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<solitaire::geometry::Position_()> *)auStack_68,(ReturnAction *)&local_48);
  testing::internal::TypedExpectation<solitaire::geometry::Position_()>::WillOnce
            (this_02,(Action<solitaire::geometry::Position_()> *)auStack_68);
  std::_Function_base::~_Function_base((_Function_base *)auStack_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.value_.
              super___shared_ptr<solitaire::geometry::Position,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

EventsProcessorLeftMouseButtonUpEventTests() {
        expectEvent(MouseLeftButtonUp {});
        EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
        EXPECT_CALL(solitaireMock, getCardsInHand()).WillOnce(ReturnRef(cardsInHand));
        EXPECT_CALL(contextMock, getCardsInHandPosition()).WillOnce(Return(cardsInHandPosition));
    }